

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O3

void duckdb::TernaryExecutor::
     ExecuteLoop<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t,duckdb::TernaryLambdaWrapperWithNulls,duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)>
               (interval_t *adata,date_t *bdata,date_t *cdata,date_t *result_data,idx_t count,
               SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
               ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
               ValidityMask *result_validity,
               _func_date_t_interval_t_date_t_date_t_ValidityMask_ptr_unsigned_long *fun)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  unsigned_long *puVar3;
  undefined4 uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  date_t dVar9;
  unsigned_long uVar10;
  ulong uVar11;
  TemplatedValidityData<unsigned_long> *pTVar12;
  _Head_base<0UL,_unsigned_long_*,_false> _Var13;
  unsigned_long uVar14;
  ulong uVar15;
  unsigned_long uVar16;
  ulong uVar17;
  idx_t idx_in_entry;
  unsigned_long uVar18;
  ulong uVar19;
  interval_t iVar20;
  interval_t iVar21;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_48;
  date_t *local_40;
  idx_t local_38;
  
  if ((((avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
        (unsigned_long *)0x0) &&
      ((bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      )) && ((cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
             (unsigned_long *)0x0)) {
    if (count != 0) {
      uVar18 = 0;
      do {
        uVar10 = uVar18;
        if (asel->sel_vector != (sel_t *)0x0) {
          uVar10 = (unsigned_long)asel->sel_vector[uVar18];
        }
        uVar14 = uVar18;
        if (bsel->sel_vector != (sel_t *)0x0) {
          uVar14 = (unsigned_long)bsel->sel_vector[uVar18];
        }
        uVar16 = uVar18;
        if (csel->sel_vector != (sel_t *)0x0) {
          uVar16 = (unsigned_long)csel->sel_vector[uVar18];
        }
        uVar1 = adata[uVar10].months;
        uVar4 = adata[uVar10].days;
        iVar20.days = uVar4;
        iVar20.months = uVar1;
        iVar20.micros = adata[uVar10].micros;
        dVar9 = (*fun)(iVar20,bdata[uVar14].days,cdata[uVar16].days,result_validity,uVar18);
        result_data[uVar18].days = dVar9.days;
        uVar18 = uVar18 + 1;
      } while (count != uVar18);
    }
  }
  else if (count != 0) {
    local_48 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar19 = 0;
    local_40 = bdata;
    do {
      uVar11 = uVar19;
      if (asel->sel_vector != (sel_t *)0x0) {
        uVar11 = (ulong)asel->sel_vector[uVar19];
      }
      uVar15 = uVar19;
      if (bsel->sel_vector != (sel_t *)0x0) {
        uVar15 = (ulong)bsel->sel_vector[uVar19];
      }
      uVar17 = uVar19;
      if (csel->sel_vector != (sel_t *)0x0) {
        uVar17 = (ulong)csel->sel_vector[uVar19];
      }
      puVar3 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((((puVar3 == (unsigned_long *)0x0) || ((puVar3[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0))
          && ((puVar3 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
              puVar3 == (unsigned_long *)0x0 || ((puVar3[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) != 0))
             )) && ((puVar3 = (cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
                    puVar3 == (unsigned_long *)0x0 ||
                    ((puVar3[uVar17 >> 6] >> (uVar17 & 0x3f) & 1) != 0)))) {
        uVar2 = adata[uVar11].months;
        uVar5 = adata[uVar11].days;
        iVar21.days = uVar5;
        iVar21.months = uVar2;
        iVar21.micros = adata[uVar11].micros;
        dVar9 = (*fun)(iVar21,bdata[uVar15].days,cdata[uVar17].days,result_validity,uVar19);
        result_data[uVar19].days = dVar9.days;
      }
      else {
        _Var13._M_head_impl =
             (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (_Var13._M_head_impl == (unsigned_long *)0x0) {
          local_38 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var8 = p_Stack_50;
          peVar7 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar7;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var8;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar12 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_48);
          _Var13._M_head_impl =
               (pTVar12->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var13._M_head_impl;
          bdata = local_40;
        }
        bVar6 = (byte)uVar19 & 0x3f;
        _Var13._M_head_impl[uVar19 >> 6] =
             _Var13._M_head_impl[uVar19 >> 6] & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6)
        ;
      }
      uVar19 = uVar19 + 1;
    } while (count != uVar19);
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, ValidityMask &result_validity, FUN fun) {
		if (!avalidity.AllValid() || !bvalidity.AllValid() || !cvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				if (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx)) {
					result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
					    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
				    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
			}
		}
	}